

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

Gia_Man_t * Gia_ManPerformMappingInt(Gia_Man_t *p,If_Par_t *pPars)

{
  char cVar1;
  int *__ptr;
  If_Par_t *pIVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  If_Man_t *pIfMan;
  If_DsdMan_t *pIVar6;
  Tim_Man_t *pTVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  uint fUnitDelay;
  
  if (pPars->pTimesArr != (float *)0x0) {
    __assert_fail("pPars->pTimesArr == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                  ,0x843,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
  }
  if (pPars->pTimesReq != (float *)0x0) {
    __assert_fail("pPars->pTimesReq == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                  ,0x844,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
  }
  if (p->pCellStr != (char *)0x0) {
    free(p->pCellStr);
    p->pCellStr = (char *)0x0;
  }
  if (p->vConfigs != (Vec_Int_t *)0x0) {
    __ptr = p->vConfigs->pArray;
    if (__ptr != (int *)0x0) {
      free(__ptr);
      p->vConfigs->pArray = (int *)0x0;
    }
    if (p->vConfigs != (Vec_Int_t *)0x0) {
      free(p->vConfigs);
      p->vConfigs = (Vec_Int_t *)0x0;
    }
  }
  if ((((pPars->fDelayOpt == 0) && (pPars->fDelayOptLut == 0)) && (pPars->fDsdBalance == 0)) &&
     (((pPars->fUserRecLib == 0 && (pPars->fDeriveLuts == 0)) &&
      ((pPars->fUseDsd == 0 && (pPars->fUseTtPerm == 0)))))) {
    pPars->fCutMin = 0;
  }
  pIfMan = Gia_ManToIf(p,pPars);
  if (pIfMan != (If_Man_t *)0x0) {
    if (pPars->fUseDsd != 0) {
      pIVar6 = (If_DsdMan_t *)Abc_FrameReadManDsd();
      iVar5 = pPars->nLutSize;
      iVar4 = If_DsdManVarNum(pIVar6);
      if (iVar4 < iVar5) {
        __assert_fail("pPars->nLutSize <= If_DsdManVarNum(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                      ,0x852,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
      }
      if (((pPars->pLutStruct != (char *)0x0) || (iVar5 = If_DsdManLutSize(pIVar6), iVar5 != 0)) &&
         ((pPars->pLutStruct == (char *)0x0 ||
          (cVar1 = *pPars->pLutStruct, iVar5 = If_DsdManLutSize(pIVar6), cVar1 + -0x30 != iVar5))))
      {
        __assert_fail("(pPars->pLutStruct == NULL && If_DsdManLutSize(p) == 0) || (pPars->pLutStruct && pPars->pLutStruct[0] - \'0\' == If_DsdManLutSize(p))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                      ,0x853,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
      }
      pIVar6 = (If_DsdMan_t *)Abc_FrameReadManDsd();
      pIfMan->pIfDsdMan = pIVar6;
      if (pPars->fDsdBalance != 0) {
        If_DsdManAllocIsops(pIVar6,pPars->nLutSize);
      }
    }
    if (pPars->fPower != 0) {
      if (p->pManTime == (void *)0x0) {
        If_ManComputeSwitching(pIfMan);
      }
      else {
        Abc_Print(0,"Switching activity computation for designs with boxes is disabled.\n");
      }
    }
    if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
      fUnitDelay = 1;
      if (((pPars->fDelayOpt == 0) && (pPars->fDelayOptLut == 0)) && (pPars->fDsdBalance == 0)) {
        fUnitDelay = (uint)(pPars->fUserRecLib != 0);
      }
      pTVar7 = Tim_ManDup((Tim_Man_t *)p->pManTime,fUnitDelay);
      pIfMan->pManTim = pTVar7;
    }
    iVar5 = If_ManPerformMapping(pIfMan);
    if (iVar5 != 0) {
      pIVar2 = pIfMan->pPars;
      if (((pIVar2->fDelayOpt == 0) && (pIVar2->fDsdBalance == 0)) && (pIVar2->fUserRecLib == 0)) {
        p_00 = Gia_ManFromIfLogic(pIfMan);
      }
      else {
        p_00 = Gia_ManFromIfAig(pIfMan);
      }
      If_ManStop(pIfMan);
      if (p_00->pName == (char *)0x0) {
        pcVar3 = p->pName;
        if (pcVar3 == (char *)0x0) {
          pcVar9 = (char *)0x0;
        }
        else {
          sVar8 = strlen(pcVar3);
          pcVar9 = (char *)malloc(sVar8 + 1);
          strcpy(pcVar9,pcVar3);
        }
        p_00->pName = pcVar9;
        pcVar3 = p->pSpec;
        if (pcVar3 == (char *)0x0) {
          pcVar9 = (char *)0x0;
        }
        else {
          sVar8 = strlen(pcVar3);
          pcVar9 = (char *)malloc(sVar8 + 1);
          strcpy(pcVar9,pcVar3);
        }
        p_00->pSpec = pcVar9;
        Gia_ManSetRegNum(p_00,p->nRegs);
        return p_00;
      }
      __assert_fail("pNew->pName == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                    ,0x86f,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
    }
    If_ManStop(pIfMan);
  }
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Gia_ManPerformMappingInt( Gia_Man_t * p, If_Par_t * pPars )
{
    extern void Gia_ManIffTest( Gia_Man_t * pGia, If_LibLut_t * pLib, int fVerbose );
    Gia_Man_t * pNew;
    If_Man_t * pIfMan;
    assert( pPars->pTimesArr == NULL );
    assert( pPars->pTimesReq == NULL );
    ABC_FREE( p->pCellStr );
    Vec_IntFreeP( &p->vConfigs );
    // disable cut minimization when GIA strucure is needed
    if ( !pPars->fDelayOpt && !pPars->fDelayOptLut && !pPars->fDsdBalance && !pPars->fUserRecLib && !pPars->fDeriveLuts && !pPars->fUseDsd && !pPars->fUseTtPerm )
        pPars->fCutMin = 0;
    // translate into the mapper
    pIfMan = Gia_ManToIf( p, pPars );    
    if ( pIfMan == NULL )
        return NULL;
    // create DSD manager
    if ( pPars->fUseDsd )
    {
        If_DsdMan_t * p = (If_DsdMan_t *)Abc_FrameReadManDsd();
        assert( pPars->nLutSize <= If_DsdManVarNum(p) );
        assert( (pPars->pLutStruct == NULL && If_DsdManLutSize(p) == 0) || (pPars->pLutStruct && pPars->pLutStruct[0] - '0' == If_DsdManLutSize(p)) );
        pIfMan->pIfDsdMan = (If_DsdMan_t *)Abc_FrameReadManDsd();
        if ( pPars->fDsdBalance )
            If_DsdManAllocIsops( pIfMan->pIfDsdMan, pPars->nLutSize );
    }
    // compute switching for the IF objects
    if ( pPars->fPower )
    {
        if ( p->pManTime == NULL )
            If_ManComputeSwitching( pIfMan );
        else
            Abc_Print( 0, "Switching activity computation for designs with boxes is disabled.\n" );
    }
    if ( p->pManTime )
        pIfMan->pManTim = Tim_ManDup( (Tim_Man_t *)p->pManTime, pPars->fDelayOpt || pPars->fDelayOptLut || pPars->fDsdBalance || pPars->fUserRecLib );
//	Tim_ManPrint( pIfMan->pManTim );
    if ( !If_ManPerformMapping( pIfMan ) )
    {
        If_ManStop( pIfMan );
        return NULL;
    }
    // transform the result of mapping into the new network
    if ( pIfMan->pPars->fDelayOpt || pIfMan->pPars->fDsdBalance || pIfMan->pPars->fUserRecLib )
        pNew = Gia_ManFromIfAig( pIfMan );
    else
        pNew = Gia_ManFromIfLogic( pIfMan );
    If_ManStop( pIfMan );
    // transfer name
    assert( pNew->pName == NULL );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}